

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaD_poscall(lua_State *L,StkId firstResult)

{
  int iVar1;
  CallInfo *pCVar2;
  bool bVar3;
  TValue *o1;
  TValue *o2;
  CallInfo *ci;
  int i;
  int wanted;
  StkId res;
  StkId firstResult_local;
  lua_State *L_local;
  
  pCVar2 = L->ci;
  L->ci = pCVar2 + -1;
  _i = pCVar2->func;
  iVar1 = pCVar2->nresults;
  L->base = pCVar2[-1].base;
  L->savedpc = pCVar2[-1].savedpc;
  ci._0_4_ = iVar1;
  res = firstResult;
  while( true ) {
    bVar3 = false;
    if ((int)ci != 0) {
      bVar3 = res < L->top;
    }
    if (!bVar3) break;
    _i->value = res->value;
    _i->tt = res->tt;
    ci._0_4_ = (int)ci + -1;
    _i = _i + 1;
    res = res + 1;
  }
  while (0 < (int)ci) {
    _i->tt = 0;
    ci._0_4_ = (int)ci + -1;
    _i = _i + 1;
  }
  L->top = _i;
  return iVar1 + 1;
}

Assistant:

static int luaD_poscall(lua_State*L,StkId firstResult){
StkId res;
int wanted,i;
CallInfo*ci;
ci=L->ci--;
res=ci->func;
wanted=ci->nresults;
L->base=(ci-1)->base;
L->savedpc=(ci-1)->savedpc;
for(i=wanted;i!=0&&firstResult<L->top;i--)
setobj(L,res++,firstResult++);
while(i-->0)
setnilvalue(res++);
L->top=res;
return(wanted-(-1));
}